

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O0

Ivy_Man_t * Ivy_FraigPerform(Ivy_Man_t *pManAig,Ivy_FraigParams_t *pParams)

{
  int iVar1;
  abctime aVar2;
  Ivy_FraigMan_t *p_00;
  abctime aVar3;
  abctime clk;
  Ivy_Man_t *pManAigNew;
  Ivy_FraigMan_t *p;
  Ivy_FraigParams_t *pParams_local;
  Ivy_Man_t *pManAig_local;
  
  iVar1 = Ivy_ManNodeNum(pManAig);
  if (iVar1 == 0) {
    pManAig_local = Ivy_ManDup(pManAig);
  }
  else {
    aVar2 = Abc_Clock();
    iVar1 = Ivy_ManLatchNum(pManAig);
    if (iVar1 != 0) {
      __assert_fail("Ivy_ManLatchNum(pManAig) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyFraig.c"
                    ,0x1cb,"Ivy_Man_t *Ivy_FraigPerform(Ivy_Man_t *, Ivy_FraigParams_t *)");
    }
    p_00 = Ivy_FraigStart(pManAig,pParams);
    Ivy_FraigSimulate(p_00);
    Ivy_FraigSweep(p_00);
    pManAig_local = p_00->pManFraig;
    aVar3 = Abc_Clock();
    p_00->timeTotal = aVar3 - aVar2;
    Ivy_FraigStop(p_00);
  }
  return pManAig_local;
}

Assistant:

Ivy_Man_t * Ivy_FraigPerform( Ivy_Man_t * pManAig, Ivy_FraigParams_t * pParams )
{
    Ivy_FraigMan_t * p;
    Ivy_Man_t * pManAigNew;
    abctime clk;
    if ( Ivy_ManNodeNum(pManAig) == 0 )
        return Ivy_ManDup(pManAig);
clk = Abc_Clock();
    assert( Ivy_ManLatchNum(pManAig) == 0 );
    p = Ivy_FraigStart( pManAig, pParams );
    Ivy_FraigSimulate( p );
    Ivy_FraigSweep( p );
    pManAigNew = p->pManFraig;
p->timeTotal = Abc_Clock() - clk;
    Ivy_FraigStop( p );
    return pManAigNew;
}